

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O1

void __thiscall gdsTEXT::gdsTEXT(gdsTEXT *this)

{
  char *__end;
  
  this->plex = 0;
  (this->presentation_flags).super__Base_bitset<1UL>._M_w = 0;
  (this->textbody)._M_dataplus._M_p = (pointer)&(this->textbody).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->textbody,"","");
  (this->text_transformation_flags).super__Base_bitset<1UL>._M_w = 0;
  this->layer = 0;
  this->text_type = 0;
  this->path_type = 0;
  this->width = 0;
  this->scale = 1.0;
  this->angle = 0.0;
  this->xCor = 0;
  this->yCor = 0;
  this->propattr = 0;
  (this->propvalue)._M_dataplus._M_p = (pointer)&(this->propvalue).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->propvalue,"","");
  return;
}

Assistant:

gdsTEXT(){}